

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
SetInstance::receive
          (SetInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  undefined8 *puVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  SetInstance *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  SetInstance *in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000010;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000040;
  SetInstance *in_stack_00000048;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000050;
  SetInstance *in_stack_00000058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  __lhs = in_RDI;
  bVar1 = std::operator==(in_RDI,(char *)in_RDI);
  if (bVar1) {
    op_get(in_RDX,in_RCX);
  }
  else {
    bVar1 = std::operator==(__lhs,(char *)in_RDI);
    if (bVar1) {
      op_isEmpty(in_stack_00000008,unaff_retaddr);
    }
    else {
      bVar1 = std::operator==(__lhs,(char *)in_RDI);
      if (bVar1) {
        op_contains(in_stack_00000048,in_stack_00000040);
      }
      else {
        bVar1 = std::operator==(__lhs,(char *)in_RDI);
        if (bVar1) {
          op_size(in_stack_00000058,in_stack_00000050);
        }
        else {
          bVar1 = std::operator==(__lhs,(char *)in_RDI);
          if (bVar1) {
            op_add(in_stack_00000048,in_stack_00000040);
          }
          else {
            bVar1 = std::operator==(__lhs,(char *)in_RDI);
            if (bVar1) {
              op_remove((SetInstance *)arguments,in_stack_00000010);
            }
            else {
              bVar1 = std::operator==(__lhs,(char *)in_RDI);
              if (!bVar1) {
                puVar2 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar2 = "RuntimeError: invalid message.";
                __cxa_throw(puVar2,&char_const*::typeinfo,0);
              }
              op_clear(in_stack_00000008,unaff_retaddr);
            }
          }
        }
      }
    }
  }
  return __lhs;
}

Assistant:

std::string SetInstance::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "get")
        return op_get(arguments);
    if (message_name == "isEmpty?")
        return op_isEmpty(arguments);
    if (message_name == "contains?")
        return op_contains(arguments);
    if (message_name == "size")
        return op_size(arguments);
    if (message_name == "add:")
        return op_add(arguments);
    if (message_name == "remove:")
        return op_remove(arguments);
    if (message_name == "clear")
        return op_clear(arguments);
    throw EXC_INVALID_MESSAGE;
}